

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.h
# Opt level: O0

t_pvalue __thiscall
xemmai::t_enum_of<std::filesystem::perms,_xemmai::t_os>::f_transfer
          (t_enum_of<std::filesystem::perms,_xemmai::t_os> *this,t_os *a_library,perms a_value)

{
  t_type *this_00;
  t_object *ptVar1;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX;
  t_pvalue tVar2;
  ulong local_28;
  perms local_1c;
  t_os *ptStack_18;
  perms a_value_local;
  t_os *a_library_local;
  
  local_1c = a_value;
  ptStack_18 = a_library;
  a_library_local = (t_os *)this;
  this_00 = t_os::f_type<std::filesystem::perms>(a_library);
  local_28 = (ulong)local_1c;
  ptVar1 = t_type_of<xemmai::t_object>::f_new<long,long>(this_00,(long *)&local_28);
  t_value<xemmai::t_pointer>::t_pointer((t_value<xemmai::t_pointer> *)this,ptVar1);
  tVar2.field_0.v_integer = extraout_RDX.v_integer;
  tVar2.super_t_pointer.v_p = (t_object *)this;
  return tVar2;
}

Assistant:

static t_pvalue f_transfer(const T_library* a_library, T a_value)
	{
		return a_library->template f_type<typename t_fundamental<T>::t_type>()->template f_new<intptr_t>(static_cast<intptr_t>(a_value));
	}